

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::Generator::FixForeignFieldsInDescriptor
          (Generator *this,Descriptor *descriptor,Descriptor *containing_descriptor)

{
  Generator *pGVar1;
  mapped_type *pmVar2;
  long lVar3;
  Descriptor *descriptor_00;
  int j;
  long lVar4;
  int i;
  long lVar5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  allocator<char> local_b9;
  Generator *local_b8;
  Descriptor *local_b0;
  long local_a8;
  undefined1 local_a0 [32];
  _Base_ptr local_80;
  size_t local_78;
  string local_70;
  key_type local_50;
  
  lVar3 = 0;
  local_b8 = (Generator *)containing_descriptor;
  for (lVar5 = 0; lVar5 < *(int *)(descriptor + 0x48); lVar5 = lVar5 + 1) {
    FixForeignFieldsInDescriptor
              (this,(Descriptor *)(*(long *)(descriptor + 0x50) + lVar3),descriptor);
    lVar3 = lVar3 + 0xa8;
  }
  lVar3 = 0;
  local_b0 = descriptor;
  for (lVar5 = 0; descriptor_00 = local_b0, lVar5 < *(int *)(local_b0 + 0x2c); lVar5 = lVar5 + 1) {
    lVar4 = *(long *)(local_b0 + 0x30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a0,"fields_by_name",(allocator<char> *)&local_70);
    FixForeignFieldsInField
              (this,descriptor_00,(FieldDescriptor *)(lVar4 + lVar3),(string *)local_a0);
    std::__cxx11::string::~string((string *)local_a0);
    lVar3 = lVar3 + 0xa8;
  }
  FixContainingTypeInDescriptor<google::protobuf::Descriptor>(this,local_b0,(Descriptor *)local_b8);
  lVar3 = 0;
  for (lVar5 = 0; lVar5 < *(int *)(descriptor_00 + 0x58); lVar5 = lVar5 + 1) {
    FixContainingTypeInDescriptor<google::protobuf::EnumDescriptor>
              (this,(EnumDescriptor *)(*(long *)(descriptor_00 + 0x60) + lVar3),descriptor_00);
    lVar3 = lVar3 + 0x38;
  }
  lVar3 = 0;
  local_b8 = this;
  while (lVar3 < *(int *)(descriptor_00 + 0x38)) {
    local_a0._8_4_ = _S_red;
    local_a0._16_8_ = 0;
    local_a0._24_8_ = local_a0 + 8;
    local_78 = 0;
    lVar5 = *(long *)(descriptor_00 + 0x40);
    local_80 = (_Base_ptr)local_a0._24_8_;
    ModuleLevelDescriptorName<google::protobuf::Descriptor>(&local_70,local_b8,descriptor_00);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"descriptor_name",&local_b9);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_a0,&local_50);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"oneof_name",(allocator<char> *)&local_50);
    local_a8 = lVar3;
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_a0,&local_70);
    std::__cxx11::string::_M_assign((string *)pmVar2);
    std::__cxx11::string::~string((string *)&local_70);
    for (lVar4 = 0; lVar4 < *(int *)(lVar3 * 0x30 + lVar5 + 0x1c); lVar4 = lVar4 + 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"field_name",(allocator<char> *)&local_50);
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_a0,&local_70);
      std::__cxx11::string::_M_assign((string *)pmVar2);
      std::__cxx11::string::~string((string *)&local_70);
      pGVar1 = local_b8;
      io::Printer::Print(local_b8->printer_,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_a0,
                         "$descriptor_name$.oneofs_by_name[\'$oneof_name$\'].fields.append(\n  $descriptor_name$.fields_by_name[\'$field_name$\'])\n"
                        );
      io::Printer::Print(pGVar1->printer_,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_a0,
                         "$descriptor_name$.fields_by_name[\'$field_name$\'].containing_oneof = $descriptor_name$.oneofs_by_name[\'$oneof_name$\']\n"
                        );
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_a0);
    descriptor_00 = local_b0;
    lVar3 = local_a8 + 1;
  }
  return;
}

Assistant:

void Generator::FixForeignFieldsInDescriptor(
    const Descriptor& descriptor,
    const Descriptor* containing_descriptor) const {
  for (int i = 0; i < descriptor.nested_type_count(); ++i) {
    FixForeignFieldsInDescriptor(*descriptor.nested_type(i), &descriptor);
  }

  for (int i = 0; i < descriptor.field_count(); ++i) {
    const FieldDescriptor& field_descriptor = *descriptor.field(i);
    FixForeignFieldsInField(&descriptor, field_descriptor, "fields_by_name");
  }

  FixContainingTypeInDescriptor(descriptor, containing_descriptor);
  for (int i = 0; i < descriptor.enum_type_count(); ++i) {
    const EnumDescriptor& enum_descriptor = *descriptor.enum_type(i);
    FixContainingTypeInDescriptor(enum_descriptor, &descriptor);
  }
  for (int i = 0; i < descriptor.oneof_decl_count(); ++i) {
    std::map<string, string> m;
    const OneofDescriptor* oneof = descriptor.oneof_decl(i);
    m["descriptor_name"] = ModuleLevelDescriptorName(descriptor);
    m["oneof_name"] = oneof->name();
    for (int j = 0; j < oneof->field_count(); ++j) {
      m["field_name"] = oneof->field(j)->name();
      printer_->Print(
          m,
          "$descriptor_name$.oneofs_by_name['$oneof_name$'].fields.append(\n"
          "  $descriptor_name$.fields_by_name['$field_name$'])\n");
      printer_->Print(
          m,
          "$descriptor_name$.fields_by_name['$field_name$'].containing_oneof = "
          "$descriptor_name$.oneofs_by_name['$oneof_name$']\n");
    }
  }
}